

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value_parser.cc
# Opt level: O0

void __thiscall iqxmlrpc::ValueBuilder::do_visit_text(ValueBuilder *this,string *text)

{
  int iVar1;
  Scalar<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *this_00;
  Scalar<int> *this_01;
  Scalar<long> *this_02;
  Scalar<bool> *this_03;
  Scalar<double> *this_04;
  Binary_data *__p;
  Date_time *this_05;
  XML_RPC_violation *this_06;
  string local_60;
  double local_40;
  bool local_31;
  long local_30;
  int local_28 [4];
  string *local_18;
  string *text_local;
  ValueBuilder *this_local;
  
  local_18 = text;
  text_local = (string *)this;
  iVar1 = StateMachine::get_state(&this->state_);
  switch(iVar1) {
  case 0:
    BuilderBase::want_exit((BuilderBase *)this);
  case 1:
    this_00 = (Scalar<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)operator_new(0x28);
    Scalar<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Scalar
              (this_00,local_18);
    std::auto_ptr<iqxmlrpc::Value_type>::reset
              (&(this->super_ValueBuilderBase).retval,(element_type *)this_00);
    break;
  case 2:
    this_01 = (Scalar<int> *)operator_new(0x10);
    local_28[0] = boost::lexical_cast<int,std::__cxx11::string>(local_18);
    Scalar<int>::Scalar(this_01,local_28);
    std::auto_ptr<iqxmlrpc::Value_type>::reset
              (&(this->super_ValueBuilderBase).retval,(element_type *)this_01);
    break;
  case 3:
    this_02 = (Scalar<long> *)operator_new(0x10);
    local_30 = boost::lexical_cast<long,std::__cxx11::string>(local_18);
    Scalar<long>::Scalar(this_02,&local_30);
    std::auto_ptr<iqxmlrpc::Value_type>::reset
              (&(this->super_ValueBuilderBase).retval,(element_type *)this_02);
    break;
  case 4:
    this_03 = (Scalar<bool> *)operator_new(0x10);
    iVar1 = boost::lexical_cast<int,std::__cxx11::string>(local_18);
    local_31 = iVar1 != 0;
    Scalar<bool>::Scalar(this_03,&local_31);
    std::auto_ptr<iqxmlrpc::Value_type>::reset
              (&(this->super_ValueBuilderBase).retval,(element_type *)this_03);
    break;
  case 5:
    this_04 = (Scalar<double> *)operator_new(0x10);
    local_40 = boost::lexical_cast<double,std::__cxx11::string>(local_18);
    Scalar<double>::Scalar(this_04,&local_40);
    std::auto_ptr<iqxmlrpc::Value_type>::reset
              (&(this->super_ValueBuilderBase).retval,(element_type *)this_04);
    break;
  case 6:
    __p = Binary_data::from_base64(local_18);
    std::auto_ptr<iqxmlrpc::Value_type>::reset
              (&(this->super_ValueBuilderBase).retval,&__p->super_Value_type);
    break;
  case 7:
    this_05 = (Date_time *)operator_new(0x60);
    Date_time::Date_time(this_05,local_18);
    std::auto_ptr<iqxmlrpc::Value_type>::reset
              (&(this->super_ValueBuilderBase).retval,(element_type *)this_05);
    break;
  default:
    this_06 = (XML_RPC_violation *)__cxa_allocate_exception(0x18);
    Parser::context_abi_cxx11_(&local_60,(this->super_ValueBuilderBase).super_BuilderBase.parser_);
    XML_RPC_violation::XML_RPC_violation(this_06,&local_60);
    __cxa_throw(this_06,&XML_RPC_violation::typeinfo,XML_RPC_violation::~XML_RPC_violation);
  }
  return;
}

Assistant:

void
ValueBuilder::do_visit_text(const std::string& text)
{
  using boost::lexical_cast;

  switch (state_.get_state()) {
  case VALUE:
    want_exit();
  case STRING:
    retval.reset(new String(text));
    break;

  case INT:
    retval.reset(new Int(lexical_cast<int>(text)));
    break;

  case INT64:
    retval.reset(new Int64(lexical_cast<int64_t>(text)));
    break;

  case BOOL:
    retval.reset(new Bool(lexical_cast<int>(text) != 0));
    break;

  case DOUBLE:
    retval.reset(new Double(lexical_cast<double>(text)));
    break;

  case BINARY:
    retval.reset(Binary_data::from_base64(text));
    break;

  case TIME:
    retval.reset(new Date_time(text));
    break;

  default:
    throw XML_RPC_violation(parser_.context());
  }
}